

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_4ffb8::RegexExpr<wchar_t>::parse(RegexExpr<wchar_t> *this,Context *con)

{
  ParserPosition *pPVar1;
  iterator *piVar2;
  int *piVar3;
  Input *pIVar4;
  Index IVar5;
  Input *pIVar6;
  element_type *peVar7;
  ulong uVar8;
  iterator __begin;
  iterator __end;
  iterator __begin_00;
  iterator __end_00;
  Index IVar9;
  int iVar10;
  bool bVar11;
  sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
  *__it;
  pointer psVar12;
  Input *pIVar13;
  _Base_type *__range3;
  _Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
  local_108;
  Input *pIStack_f0;
  Index local_e8;
  _Executor<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>,_std::__cxx11::regex_traits<wchar_t>,_false>
  __executor;
  
  pPVar1 = &con->position;
  pIVar4 = (pPVar1->it).buffer;
  IVar5 = (con->position).it.idx;
  __begin_00 = pPVar1->it;
  __begin = pPVar1->it;
  piVar2 = &con->finish;
  pIVar6 = piVar2->buffer;
  pIVar13 = (Input *)(con->finish).idx;
  __end_00 = *piVar2;
  __end = *piVar2;
  local_108._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pIStack_f0 = (Input *)0x0;
  local_108._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8 = 0xffffffffffffffff;
  peVar7 = (this->r)._M_automaton.
           super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<wchar_t>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (peVar7 == (element_type *)0x0) {
LAB_0013cc7c:
    bVar11 = false;
  }
  else {
    __executor._M_cur_results.
    super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    __executor._M_cur_results.
    super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xffffffffffffffff;
    __executor._M_cur_results.
    super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __executor._M_current.s.buffer = (Input *)0xffffffffffffffff;
    __executor._M_current.s.idx._0_1_ = 0;
    pIStack_f0 = pIVar4;
    local_e8 = IVar5;
    std::
    vector<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
    ::assign((vector<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
              *)&local_108,(ulong)((int)(peVar7->super__NFA_base)._M_subexpr_count + 3),
             (value_type *)&__executor);
    if (((this->r)._M_flags & 0x400) == 0) {
      std::__detail::
      _Executor<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>,_std::__cxx11::regex_traits<wchar_t>,_true>
      ::_Executor((_Executor<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>,_std::__cxx11::regex_traits<wchar_t>,_true>
                   *)&__executor,
                  (IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>)__begin,
                  (IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>)__end,
                  (_ResultsVec *)&local_108,&this->r,0x40);
      bVar11 = std::__detail::
               _Executor<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>,_std::__cxx11::regex_traits<wchar_t>,_true>
               ::_M_search_from_first
                         ((_Executor<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>,_std::__cxx11::regex_traits<wchar_t>,_true>
                           *)&__executor);
      if (!bVar11) {
        if (((uint)__executor._M_states._M_visited_states._M_t.
                   super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
                   super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
                   super__Head_base<0UL,_bool_*,_false>._M_head_impl & 0x40) != 0) {
LAB_0013cc3b:
          std::__detail::
          _Executor<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>,_std::__cxx11::regex_traits<wchar_t>,_true>
          ::~_Executor((_Executor<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>,_std::__cxx11::regex_traits<wchar_t>,_true>
                        *)&__executor);
LAB_0013cc51:
          __executor._M_current.s.idx._0_1_ = 0;
          __executor._M_cur_results.
          super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)pIVar6;
          __executor._M_cur_results.
          super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)pIVar13;
          __executor._M_cur_results.
          super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pIVar6;
          __executor._M_current.s.buffer = pIVar13;
          std::
          vector<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
          ::assign((vector<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
                    *)&local_108,3,(value_type *)&__executor);
          goto LAB_0013cc7c;
        }
        __executor._M_states._M_visited_states._M_t.
        super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
        super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
        super__Head_base<0UL,_bool_*,_false>._M_head_impl._0_4_ =
             (uint)__executor._M_states._M_visited_states._M_t.
                   super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
                   super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
                   super__Head_base<0UL,_bool_*,_false>._M_head_impl | 0x80;
        do {
          if ((__executor._M_begin.s.buffer == __executor._M_end.s.buffer) &&
             (__executor._M_begin.s.idx == __executor._M_end.s.idx)) goto LAB_0013cc3b;
          __executor._M_begin.s.idx = __executor._M_begin.s.idx + 1;
          bVar11 = std::__detail::
                   _Executor<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>,_std::__cxx11::regex_traits<wchar_t>,_true>
                   ::_M_search_from_first
                             ((_Executor<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>,_std::__cxx11::regex_traits<wchar_t>,_true>
                               *)&__executor);
        } while (!bVar11);
      }
      std::__detail::
      _Executor<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>,_std::__cxx11::regex_traits<wchar_t>,_true>
      ::~_Executor((_Executor<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>,_std::__cxx11::regex_traits<wchar_t>,_true>
                    *)&__executor);
      psVar12 = local_108._M_impl.super__Vector_impl_data._M_start;
    }
    else {
      std::__detail::
      _Executor<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>,_std::__cxx11::regex_traits<wchar_t>,_false>
      ::_Executor(&__executor,
                  (IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>)__begin_00,
                  (IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>)__end_00,
                  (_ResultsVec *)&local_108,&this->r,0x40);
      bVar11 = std::__detail::
               _Executor<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>,_std::__cxx11::regex_traits<wchar_t>,_false>
               ::_M_search_from_first(&__executor);
      if (!bVar11) {
        if ((__executor._M_flags & 0x40) != 0) {
LAB_0013cc47:
          std::__detail::
          _Executor<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>,_std::__cxx11::regex_traits<wchar_t>,_false>
          ::~_Executor(&__executor);
          goto LAB_0013cc51;
        }
        __executor._M_flags = __executor._M_flags | 0x80;
        do {
          if ((__executor._M_begin.s.buffer == __executor._M_end.s.buffer) &&
             (__executor._M_begin.s.idx == __executor._M_end.s.idx)) goto LAB_0013cc47;
          __executor._M_begin.s.idx = __executor._M_begin.s.idx + 1;
          bVar11 = std::__detail::
                   _Executor<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>,_std::__cxx11::regex_traits<wchar_t>,_false>
                   ::_M_search_from_first(&__executor);
        } while (!bVar11);
      }
      std::__detail::
      _Executor<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>,_std::__cxx11::regex_traits<wchar_t>,_false>
      ::~_Executor(&__executor);
      psVar12 = local_108._M_impl.super__Vector_impl_data._M_start;
    }
    for (; psVar12 != local_108._M_impl.super__Vector_impl_data._M_finish; psVar12 = psVar12 + 1) {
      if (psVar12->matched == false) {
        (psVar12->
        super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
        ).second.s.buffer = pIVar6;
        (psVar12->
        super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
        ).second.s.idx = (Index)pIVar13;
        (psVar12->
        super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
        ).first.s.buffer =
             (psVar12->
             super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
             ).second.s.buffer;
        (psVar12->
        super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
        ).first.s.idx =
             (psVar12->
             super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
             ).second.s.idx;
      }
    }
    local_108._M_impl.super__Vector_impl_data._M_finish[-2].
    super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
    .first.s.buffer = pIVar4;
    local_108._M_impl.super__Vector_impl_data._M_finish[-2].
    super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
    .first.s.idx = IVar5;
    IVar9 = ((local_108._M_impl.super__Vector_impl_data._M_start)->
            super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
            ).first.s.idx;
    local_108._M_impl.super__Vector_impl_data._M_finish[-2].
    super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
    .second.s.buffer =
         ((local_108._M_impl.super__Vector_impl_data._M_start)->
         super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
         ).first.s.buffer;
    local_108._M_impl.super__Vector_impl_data._M_finish[-2].
    super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
    .second.s.idx = IVar9;
    local_108._M_impl.super__Vector_impl_data._M_finish[-2].matched =
         IVar5 != local_108._M_impl.super__Vector_impl_data._M_finish[-2].
                  super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
                  .second.s.idx ||
         pIVar4 != local_108._M_impl.super__Vector_impl_data._M_finish[-2].
                   super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
                   .second.s.buffer;
    IVar5 = ((local_108._M_impl.super__Vector_impl_data._M_start)->
            super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
            ).second.s.idx;
    local_108._M_impl.super__Vector_impl_data._M_finish[-1].
    super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
    .first.s.buffer =
         ((local_108._M_impl.super__Vector_impl_data._M_start)->
         super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
         ).second.s.buffer;
    local_108._M_impl.super__Vector_impl_data._M_finish[-1].
    super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
    .first.s.idx = IVar5;
    local_108._M_impl.super__Vector_impl_data._M_finish[-1].
    super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
    .second.s.buffer = pIVar6;
    local_108._M_impl.super__Vector_impl_data._M_finish[-1].
    super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
    .second.s.idx = (Index)pIVar13;
    local_108._M_impl.super__Vector_impl_data._M_finish[-1].matched =
         pIVar13 !=
         (Input *)local_108._M_impl.super__Vector_impl_data._M_finish[-1].
                  super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
                  .first.s.idx ||
         pIVar6 != local_108._M_impl.super__Vector_impl_data._M_finish[-1].
                   super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
                   .first.s.buffer;
    psVar12 = local_108._M_impl.super__Vector_impl_data._M_start;
    if ((long)local_108._M_impl.super__Vector_impl_data._M_finish -
        (long)local_108._M_impl.super__Vector_impl_data._M_start == 0x78) {
      psVar12 = local_108._M_impl.super__Vector_impl_data._M_finish + -3;
    }
    if (local_108._M_impl.super__Vector_impl_data._M_finish ==
        local_108._M_impl.super__Vector_impl_data._M_start) {
      psVar12 = local_108._M_impl.super__Vector_impl_data._M_finish + -3;
    }
    bVar11 = true;
    if (psVar12->matched == true) {
      pIVar13 = (Input *)std::
                         distance<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,wchar_t,char32_t>>
                                   ((IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>)
                                    (psVar12->
                                    super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
                                    ).first.s,
                                    (IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>)
                                    (psVar12->
                                    super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
                                    ).second.s);
    }
    else {
      pIVar13 = (Input *)0x0;
    }
  }
  std::
  _Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
  ::~_Vector_base(&local_108);
  uVar8 = (con->position).it.idx;
  if (bVar11 == false) {
    if ((con->error_pos).it.idx < uVar8) {
      iVar10 = (con->position).col;
      (con->error_pos).line = (con->position).line;
      (con->error_pos).col = iVar10;
      IVar5 = (con->position).it.idx;
      (con->error_pos).it.buffer = (con->position).it.buffer;
      (con->error_pos).it.idx = IVar5;
    }
  }
  else {
    (con->position).it.idx = (long)pIVar13->local_buffer + (uVar8 - 0x40);
    piVar3 = &(con->position).col;
    *piVar3 = *piVar3 + (int)pIVar13;
  }
  return bVar11;
}

Assistant:

bool parse(Context &con) const
	{
		size_t length;
		if (regexMatch(con.position.it, con.finish, r, length))
		{
			con.consume(length);
			return true;
		}
		con.set_error_pos();
		return false;
	}